

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryImagesLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryImagesLoader::begin__image
          (LibraryImagesLoader *this,image__AttributeData *attributeData)

{
  uint64 uVar1;
  Image *pIVar2;
  allocator<char> local_39;
  UniqueId local_38;
  
  pIVar2 = (Image *)operator_new(0x180);
  IFilePartLoader::createUniqueIdFromId(&local_38,(IFilePartLoader *)this,attributeData->id,IMAGE);
  COLLADAFW::Image::Image(pIVar2,&local_38);
  this->mCurrentImage = pIVar2;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id == (char *)0x0) goto LAB_007ff142;
    pIVar2 = this->mCurrentImage;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->id,&local_39);
    std::__cxx11::string::_M_assign((string *)&pIVar2->mName);
  }
  else {
    pIVar2 = this->mCurrentImage;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pIVar2->mName);
  }
  if (local_38._0_8_ != (long)&local_38 + 0x10U) {
    operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
  }
  if (attributeData->id != (char *)0x0) {
    pIVar2 = this->mCurrentImage;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->id,&local_39);
    std::__cxx11::string::_M_assign((string *)&pIVar2->mOriginalId);
    if (local_38._0_8_ != (long)&local_38 + 0x10U) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
  }
LAB_007ff142:
  if (attributeData->format != (char *)0x0) {
    pIVar2 = this->mCurrentImage;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->format,&local_39);
    std::__cxx11::string::_M_assign((string *)&pIVar2->mFormat);
    if (local_38._0_8_ != (long)&local_38 + 0x10U) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
  }
  pIVar2 = this->mCurrentImage;
  uVar1 = attributeData->width;
  pIVar2->mHeight = (int)attributeData->height;
  pIVar2->mWidth = (int)uVar1;
  pIVar2->mDepth = (uint)attributeData->depth;
  return true;
}

Assistant:

bool LibraryImagesLoader::begin__image( const image__AttributeData& attributeData )
	{
		mCurrentImage = FW_NEW COLLADAFW::Image( createUniqueIdFromId( attributeData.id, COLLADAFW::Image::ID()) );

		if ( attributeData.name )
			mCurrentImage->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentImage->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentImage->setOriginalId ( (const char*)attributeData.id );

		if ( attributeData.format )
			mCurrentImage->setFormat( attributeData.format );
		
		mCurrentImage->setHeight( (unsigned long)attributeData.height );
		mCurrentImage->setWidth( (unsigned long)attributeData.width );
		mCurrentImage->setDepth( (unsigned long)attributeData.depth );

		return true;
	}